

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O0

ssize_t __thiscall MemFile::read(MemFile *this,int __fd,void *__buf,size_t __nbytes)

{
  uint *puVar1;
  undefined4 in_register_00000034;
  int local_30;
  uint local_2c;
  uint local_28;
  int avail_items;
  int count_local;
  int len_local;
  void *buf_local;
  MemFile *this_local;
  
  _count_local = CONCAT44(in_register_00000034,__fd);
  local_28 = (uint)__nbytes;
  avail_items = (int)__buf;
  this_local._4_4_ = local_28;
  if (avail_items != 0) {
    buf_local = this;
    local_30 = remaining(this);
    local_30 = local_30 / avail_items;
    puVar1 = (uint *)std::min<int>((int *)&local_28,&local_30);
    local_2c = *puVar1;
    read(this,(int)_count_local,(void *)(ulong)(local_2c * avail_items),__nbytes);
    this_local._4_4_ = local_2c;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int MemFile::read(void* buf, int len, int count)
{
    if (!len) return count; // can read as many zero-length units as requested!

    auto avail_items = std::min(count, remaining() / len);
    read(buf, avail_items * len);
    return avail_items;
}